

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::AddGeneratorTarget(cmLocalGenerator *this,cmGeneratorTarget *gt)

{
  string *psVar1;
  cmGeneratorTarget *local_20;
  
  local_20 = gt;
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
            (&this->GeneratorTargets,&local_20);
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(local_20);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget*>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string_const&,cmGeneratorTarget*&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget*>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->GeneratorTargetSearchIndex,psVar1,&local_20);
  cmGlobalGenerator::IndexGeneratorTarget(this->GlobalGenerator,local_20);
  return;
}

Assistant:

void cmLocalGenerator::AddGeneratorTarget(cmGeneratorTarget* gt)
{
  this->GeneratorTargets.push_back(gt);
  this->GeneratorTargetSearchIndex.emplace(gt->GetName(), gt);
  this->GlobalGenerator->IndexGeneratorTarget(gt);
}